

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidDelegate.cpp
# Opt level: O1

void __thiscall MeshLib::SolidDelegate::removeFace2(SolidDelegate *this,Solid *pS,Face *f)

{
  int *piVar1;
  HalfEdge *pHVar2;
  Vertex *v;
  pointer pcVar3;
  HalfEdge *he;
  EditVertexTrait *pEVar4;
  undefined8 *puVar5;
  Node<MeshLib::Face> *pNVar6;
  long *plVar7;
  long lVar8;
  FaceHalfedgeIterator fhiter;
  HalfEdge *helist [3];
  Face *local_58;
  HalfEdge *local_50;
  
  if (f != (Face *)0x0) {
    local_50 = f->m_halfedge;
    local_58 = f;
    if (local_50 != (HalfEdge *)0x0) {
      plVar7 = (long *)&stack0xffffffffffffffb8;
      do {
        *plVar7 = (long)local_50;
        this = (SolidDelegate *)&stack0xffffffffffffffa8;
        FaceHalfedgeIterator::operator++((FaceHalfedgeIterator *)&stack0xffffffffffffffa8);
        plVar7 = plVar7 + 1;
      } while (local_50 != (HalfEdge *)0x0);
    }
    lVar8 = 0;
    do {
      pHVar2 = *(HalfEdge **)(&stack0xffffffffffffffb8 + lVar8 * 8);
      v = pHVar2->m_vertex;
      if (v->m_halfedge == pHVar2) {
        this = (SolidDelegate *)v;
        pEVar4 = trait<MeshLib::EditVertexTrait,MeshLib::Vertex>(v);
        for (puVar5 = (undefined8 *)**(undefined8 **)(pEVar4 + 0x30); puVar5 != (undefined8 *)0x0;
            puVar5 = (undefined8 *)puVar5[1]) {
          if ((HalfEdge *)*puVar5 != pHVar2) {
            v->m_halfedge = (HalfEdge *)*puVar5;
            break;
          }
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar8 = 0;
    do {
      removeHalfedge(this,pS,*(HalfEdge **)(&stack0xffffffffffffffb8 + lVar8 * 8));
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    pNVar6 = AVL::Node<MeshLib::Face>::remove_node((pS->m_faces).root,f);
    (pS->m_faces).root = pNVar6;
    if (pNVar6 != (Node<MeshLib::Face> *)0x0) {
      piVar1 = &(pS->m_faces).size;
      *piVar1 = *piVar1 + -1;
    }
    if (f->m_trait != (Trait *)0x0) {
      Trait::clear(&f->m_trait);
    }
    pcVar3 = (f->m_string)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &(f->m_string).field_2) {
      operator_delete(pcVar3);
    }
    operator_delete(f);
  }
  return;
}

Assistant:

void SolidDelegate::removeFace2(Solid *pS,  Face * f )
{
	if( f == NULL ) return;

	HalfEdge * helist[3];

	int i =0;
	for( FaceHalfedgeIterator fhiter(f); !fhiter.end(); ++fhiter)
	{
		HalfEdge * he = *fhiter;
		helist[i] = he;
		i++;
	}
	
	for( i =0; i < 3; i++)
	{
		Vertex *vt = helist[i]->target();
		if( vt->halfedge() == helist[i])
		{
			for( ListIterator<HalfEdge> liter( *v_edit_halfedge(vt)); !liter.end(); ++liter)
			{
				HalfEdge *he = *liter;
				if( he != helist[i])
				{
					vt->halfedge() = he;
					break;
				}
			}
		}
	}
	for( i = 0; i < 3; i ++ )
	{
		removeHalfedge(pS, helist[i] );
	}


	pS->m_faces.remove( f );

	if( f->trait() != NULL )
	{
		Trait::clear( f->trait() );
	}
	delete f;
}